

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Multiline_Input.H
# Opt level: O0

void __thiscall Fl_Multiline_Input::~Fl_Multiline_Input(Fl_Multiline_Input *this)

{
  Fl_Multiline_Input *this_local;
  
  ~Fl_Multiline_Input(this);
  operator_delete(this,200);
  return;
}

Assistant:

class FL_EXPORT Fl_Multiline_Input : public Fl_Input {
public:
  /**
    Creates a new Fl_Multiline_Input widget using the given
    position, size, and label string. The default boxtype is FL_DOWN_BOX.

    Inherited destructor destroys the widget and any value associated with it.
  */
  Fl_Multiline_Input(int X,int Y,int W,int H,const char *l = 0);
}